

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ArenaImpl::~ArenaImpl(ArenaImpl *this)

{
  ArenaImpl *in_RDI;
  ArenaImpl *unaff_retaddr;
  
  CleanupList(in_RDI);
  FreeBlocks(unaff_retaddr);
  return;
}

Assistant:

ArenaImpl::~ArenaImpl() {
  // Have to do this in a first pass, because some of the destructors might
  // refer to memory in other blocks.
  CleanupList();
  FreeBlocks();
}